

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

string * __thiscall
clask::request::cookie_value(string *__return_storage_ptr__,request *this,string *name)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  long *plVar4;
  size_t sVar5;
  pointer pbVar6;
  pointer ppVar7;
  bool bVar8;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  pointer local_118;
  size_type local_110;
  char local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  long *local_f8;
  size_t local_f0;
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  request *local_b8;
  string *local_b0;
  string *local_a8;
  undefined1 *local_a0;
  size_t local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_118 = &local_108;
  local_110 = 0;
  local_108 = '\0';
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  ppVar7 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->headers).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = this;
  local_a8 = name;
  if (ppVar7 != local_78) {
    local_b8 = (request *)&this->uri;
    local_b0 = __return_storage_ptr__;
    do {
      iVar2 = std::__cxx11::string::compare((char *)ppVar7);
      if (iVar2 == 0) {
        local_80 = ppVar7;
        split_string(&local_68,&ppVar7->second,';',0xffffffffffffffff);
        local_70 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar8 = false;
          pbVar6 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar1 = (pbVar6->_M_dataplus)._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar1,pcVar1 + pbVar6->_M_string_length);
            local_d8[0] = local_c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d8," \t\v\r\n","");
            lVar3 = std::__cxx11::string::find_first_not_of((char *)&local_50,(ulong)local_d8[0],0);
            if (lVar3 != -1) {
              std::__cxx11::string::find_last_not_of
                        ((char *)&local_50,(ulong)local_d8[0],0xffffffffffffffff);
              std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_50);
              std::__cxx11::string::operator=((string *)&local_50,(string *)&local_f8);
              if (local_f8 != local_e8) {
                operator_delete(local_f8,local_e8[0] + 1);
              }
            }
            if (local_d8[0] != local_c8) {
              operator_delete(local_d8[0],local_c8[0] + 1);
            }
            split_string((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_f8,&local_50,'=',0xffffffffffffffff);
            sVar5 = local_f0;
            plVar4 = local_f8;
            if ((local_f0 - (long)local_f8 == 0x40) &&
               (__n = local_f8[1], __n == local_a8->_M_string_length)) {
              if (__n != 0) {
                iVar2 = bcmp((void *)*local_f8,(local_a8->_M_dataplus)._M_p,__n);
                if (iVar2 != 0) goto LAB_00125b09;
              }
              std::__cxx11::string::_M_assign((string *)&local_118);
              bVar8 = true;
              plVar4 = local_f8;
              sVar5 = local_f0;
            }
LAB_00125b09:
            if (sVar5 - (long)plVar4 == 0x40) {
              iVar2 = std::__cxx11::string::compare((char *)plVar4);
              if (iVar2 == 0) {
                std::__cxx11::string::_M_assign((string *)&local_a0);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            pbVar6 = pbVar6 + 1;
          } while (pbVar6 != local_70);
          if (bVar8) {
            if (local_98 != 0) {
              std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_b8);
              plVar4 = local_f8;
              if (local_f0 == local_98) {
                if (local_f0 == 0) {
                  bVar8 = true;
                }
                else {
                  iVar2 = bcmp(local_f8,local_a0,local_f0);
                  bVar8 = iVar2 == 0;
                }
              }
              else {
                bVar8 = false;
              }
              if (plVar4 != local_e8) {
                operator_delete(plVar4,local_e8[0] + 1);
              }
              if (!bVar8) goto LAB_00125c06;
            }
            __return_storage_ptr__ = local_b0;
            (local_b0->_M_dataplus)._M_p = (pointer)&local_b0->field_2;
            if (local_118 == &local_108) {
              (local_b0->field_2)._M_allocated_capacity = CONCAT71(uStack_107,local_108);
              *(undefined8 *)((long)&local_b0->field_2 + 8) = uStack_100;
            }
            else {
              (local_b0->_M_dataplus)._M_p = local_118;
              (local_b0->field_2)._M_allocated_capacity = CONCAT71(uStack_107,local_108);
            }
            local_b0->_M_string_length = local_110;
            local_110 = 0;
            local_108 = '\0';
            local_118 = &local_108;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_68);
            goto LAB_00125c4b;
          }
        }
LAB_00125c06:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        ppVar7 = local_80;
        __return_storage_ptr__ = local_b0;
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != local_78);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00125c4b:
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string request::cookie_value(const std::string& name) {
  std::string value, path;
  for (auto&& header : headers) {
    if (header.first == "Cookie") {
      auto elems = split_string(header.second, ';');
      auto found = false;
      for (auto&& elem : elems) {
        auto v = elem;
        trim_string(v);
        auto toks = split_string(v, '=');
        if (toks.size() == 2 && toks[0] == name) {
          value = toks[1];
          found = true;
        }
        if (toks.size() == 2 && toks[0] == "path") {
          path = toks[1];
        }
      }
      if (found) {
        if (path.empty() || uri.substr(path.size()) == path) {
          return value;
        }
      }
    }
  }
  return "";
}